

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

bool __thiscall
SafeQueueWithNotification<WriterData>::push
          (SafeQueueWithNotification<WriterData> *this,WriterData *val)

{
  bool bVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lk;
  WriterData *val_local;
  SafeQueueWithNotification<WriterData> *this_local;
  
  lk._M_device = (mutex_type *)val;
  std::lock_guard<std::mutex>::lock_guard(&local_28,this->m_mtx);
  bVar1 = SafeQueue<WriterData>::push(&this->super_SafeQueue<WriterData>,(WriterData *)lk._M_device)
  ;
  if (bVar1) {
    std::condition_variable::notify_one();
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return bVar1;
}

Assistant:

bool push(const T& val) override
    {
        std::lock_guard lk(m_mtx);

        if (!SafeQueue<T>::push(val))
            return false;

        m_cond.notify_one();

        return true;
    }